

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ribbon_artist.cpp
# Opt level: O0

void __thiscall polyscope::RibbonArtist::createProgram(RibbonArtist *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  long *plVar9;
  ulong uVar10;
  bool bVar11;
  element_type *peVar12;
  size_type sVar13;
  reference this_00;
  element_type *peVar14;
  long in_RDI;
  undefined8 uVar15;
  vec3 vVar16;
  vec<3,_float,_(glm::qualifier)0> vVar17;
  vec3 fakeLast;
  array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL> *pn;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
  *__range2_1;
  vec3 fakeFirst;
  float EPS;
  vec3 lineColor;
  array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL> *x;
  iterator __end2;
  iterator __begin2;
  vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
  *__range2;
  vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
  line;
  size_t iLine;
  ValueColorMap *cmapValue;
  uint nPts;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  colors;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  normals;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  positions;
  float normalOffset;
  uint restartInd;
  vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
  *in_stack_fffffffffffffb68;
  vec<3,_float,_(glm::qualifier)0> *in_stack_fffffffffffffb70;
  vec<3,_float,_(glm::qualifier)0> *in_stack_fffffffffffffb78;
  vec<3,_float,_(glm::qualifier)0> *in_stack_fffffffffffffb80;
  vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
  *in_stack_fffffffffffffbb8;
  vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
  *in_stack_fffffffffffffbc0;
  string *in_stack_fffffffffffffbc8;
  undefined4 in_stack_fffffffffffffbd0;
  undefined4 in_stack_fffffffffffffbd4;
  double in_stack_fffffffffffffc18;
  ValueColorMap *in_stack_fffffffffffffc20;
  string *in_stack_fffffffffffffc60;
  ShaderProgram *in_stack_fffffffffffffc68;
  undefined4 in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc74;
  allocator local_2c1;
  string local_2c0 [39];
  allocator local_299;
  string local_298 [39];
  allocator local_271;
  string local_270 [36];
  int local_24c;
  undefined8 local_248;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_240;
  undefined8 local_238;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_230;
  undefined8 local_228;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_220;
  undefined8 local_218;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_210;
  undefined8 local_208;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_200;
  undefined8 local_1f8;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_1f0;
  int local_1ec;
  reference local_1e8;
  array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL> *local_1e0;
  __normal_iterator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_*,_std::vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>_>
  local_1d8;
  vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
  *local_1d0;
  int local_1c4;
  undefined8 local_1c0;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_1b8;
  undefined8 local_1b0;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_1a8;
  undefined8 local_1a0;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_198;
  undefined8 local_190;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_188;
  undefined8 local_180;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_178;
  undefined8 local_170;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_168;
  undefined4 local_164;
  undefined8 local_160;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_158;
  undefined8 local_150;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_148;
  undefined4 local_144;
  vec<3,_float,_(glm::qualifier)0> local_140;
  vec<3,_float,_(glm::qualifier)0> local_130;
  reference local_120;
  array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL> *local_118;
  __normal_iterator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_*,_std::vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>_>
  local_110;
  vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
  *local_108;
  vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
  local_100;
  ulong local_e8;
  ValueColorMap *local_e0;
  int local_d4;
  undefined1 local_d0 [24];
  undefined1 local_b8 [24];
  undefined1 local_a0 [24];
  undefined1 local_88 [24];
  float local_70;
  uint local_6c;
  undefined1 local_68 [16];
  undefined8 local_58;
  allocator local_39;
  string local_38 [32];
  undefined1 local_18 [24];
  
  plVar9 = render::engine;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"RIBBON",&local_39);
  local_68 = (undefined1  [16])0x0;
  local_58 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x3d8ef2);
  (**(code **)(*plVar9 + 0x118))(local_18,plVar9,local_38,local_68,0);
  std::shared_ptr<polyscope::render::ShaderProgram>::operator=
            ((shared_ptr<polyscope::render::ShaderProgram> *)in_stack_fffffffffffffb70,
             (shared_ptr<polyscope::render::ShaderProgram> *)in_stack_fffffffffffffb68);
  std::shared_ptr<polyscope::render::ShaderProgram>::~shared_ptr
            ((shared_ptr<polyscope::render::ShaderProgram> *)0x3d8f5c);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffb80);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_6c = 0xffffffff;
  peVar12 = std::
            __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x3d8f9b);
  (*peVar12->_vptr_ShaderProgram[0x1d])(peVar12,(ulong)local_6c);
  local_70 = (float)(polyscope::state::lengthScale * *(double *)(in_RDI + 0x40));
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            *)0x3d8fe7);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            *)0x3d8ff4);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            *)0x3d9001);
  geometrycentral::surface::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x3d900e);
  local_d4 = 0;
  local_e0 = render::Engine::getColorMap
                       ((Engine *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                        in_stack_fffffffffffffbc8);
  for (local_e8 = 0; uVar10 = local_e8,
      sVar13 = std::
               vector<std::vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>,_std::allocator<std::vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>_>_>
               ::size((vector<std::vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>,_std::allocator<std::vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>_>_>
                       *)(in_RDI + 0x28)), uVar10 < sVar13; local_e8 = local_e8 + 1) {
    std::
    vector<std::vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>,_std::allocator<std::vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>_>_>
    ::operator[]((vector<std::vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>,_std::allocator<std::vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>_>_>
                  *)(in_RDI + 0x28),local_e8);
    std::
    vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
    ::vector(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
    local_108 = &local_100;
    local_110._M_current =
         (array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL> *)
         std::
         vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
         ::begin(in_stack_fffffffffffffb68);
    local_118 = (array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL> *)
                std::
                vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                ::end(in_stack_fffffffffffffb68);
    while (bVar11 = __gnu_cxx::operator!=
                              ((__normal_iterator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_*,_std::vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>_>
                                *)in_stack_fffffffffffffb70,
                               (__normal_iterator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_*,_std::vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>_>
                                *)in_stack_fffffffffffffb68), bVar11) {
      local_120 = __gnu_cxx::
                  __normal_iterator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_*,_std::vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>_>
                  ::operator*(&local_110);
      std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>::operator[]
                ((array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL> *)in_stack_fffffffffffffb70,
                 (size_type)in_stack_fffffffffffffb68);
      uVar15 = 0;
      vVar17 = glm::operator*(in_stack_fffffffffffffb80,
                              (float)((ulong)in_stack_fffffffffffffb78 >> 0x20));
      local_140.field_2 = vVar17.field_2;
      auVar8._8_8_ = uVar15;
      auVar8._0_8_ = vVar17._0_8_;
      local_140._0_8_ = vmovlpd_avx(auVar8);
      local_130._0_8_ = local_140._0_8_;
      local_130.field_2 = local_140.field_2;
      this_00 = std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>::operator[]
                          ((array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL> *)
                           in_stack_fffffffffffffb70,(size_type)in_stack_fffffffffffffb68);
      glm::vec<3,float,(glm::qualifier)0>::operator+=
                ((vec<3,float,(glm::qualifier)0> *)this_00,&local_130);
      __gnu_cxx::
      __normal_iterator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_*,_std::vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>_>
      ::operator++(&local_110);
    }
    sVar13 = std::
             vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
             ::size(&local_100);
    if (sVar13 < 2) {
      local_144 = 4;
    }
    else {
      randomUnit();
      uVar15 = 0;
      vVar16 = render::ValueColorMap::getValue(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
      local_158 = vVar16.field_2;
      auVar7._8_8_ = uVar15;
      auVar7._0_8_ = vVar16._0_8_;
      local_160 = vmovlpd_avx(auVar7);
      local_164 = 0x3c23d70a;
      local_150 = local_160;
      local_148 = local_158;
      std::
      vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
      ::operator[](&local_100,0);
      in_stack_fffffffffffffc68 =
           (ShaderProgram *)
           std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>::operator[]
                     ((array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL> *)in_stack_fffffffffffffb70
                      ,(size_type)in_stack_fffffffffffffb68);
      uVar15 = 0;
      in_stack_fffffffffffffc74 = local_164;
      std::
      vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
      ::operator[](&local_100,0);
      std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>::operator[]
                ((array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL> *)in_stack_fffffffffffffb70,
                 (size_type)in_stack_fffffffffffffb68);
      std::
      vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
      ::operator[](&local_100,1);
      std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>::operator[]
                ((array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL> *)in_stack_fffffffffffffb70,
                 (size_type)in_stack_fffffffffffffb68);
      vVar17 = glm::operator-(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
      local_198 = vVar17.field_2;
      in_stack_fffffffffffffc60 = (string *)0x0;
      auVar6._8_8_ = uVar15;
      auVar6._0_8_ = vVar17._0_8_;
      local_1a0 = vmovlpd_avx(auVar6);
      local_190 = local_1a0;
      local_188 = local_198;
      vVar17 = glm::operator*(SUB84(in_stack_fffffffffffffb78,0),in_stack_fffffffffffffb70);
      local_1a8 = vVar17.field_2;
      uVar15 = 0;
      auVar5._8_8_ = in_stack_fffffffffffffc60;
      auVar5._0_8_ = vVar17._0_8_;
      local_1b0 = vmovlpd_avx(auVar5);
      local_180 = local_1b0;
      local_178 = local_1a8;
      vVar17 = glm::operator+(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
      local_1b8 = vVar17.field_2;
      auVar4._8_8_ = uVar15;
      auVar4._0_8_ = vVar17._0_8_;
      local_1c0 = vmovlpd_avx(auVar4);
      local_170 = local_1c0;
      local_168 = local_1b8;
      std::
      vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ::push_back((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
      std::
      vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
      ::front((vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
               *)in_stack_fffffffffffffb70);
      std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>::operator[]
                ((array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL> *)in_stack_fffffffffffffb70,
                 (size_type)in_stack_fffffffffffffb68);
      std::
      vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ::push_back((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
      std::
      vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ::push_back((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
      local_1c4 = local_d4;
      local_d4 = local_d4 + 1;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffb70,
                 (value_type_conflict6 *)in_stack_fffffffffffffb68);
      local_1d0 = &local_100;
      local_1d8._M_current =
           (array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL> *)
           std::
           vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
           ::begin(in_stack_fffffffffffffb68);
      local_1e0 = (array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL> *)
                  std::
                  vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                  ::end(in_stack_fffffffffffffb68);
      while (bVar11 = __gnu_cxx::operator!=
                                ((__normal_iterator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_*,_std::vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>_>
                                  *)in_stack_fffffffffffffb70,
                                 (__normal_iterator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_*,_std::vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>_>
                                  *)in_stack_fffffffffffffb68), bVar11) {
        local_1e8 = __gnu_cxx::
                    __normal_iterator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_*,_std::vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>_>
                    ::operator*(&local_1d8);
        std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>::operator[]
                  ((array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL> *)in_stack_fffffffffffffb70,
                   (size_type)in_stack_fffffffffffffb68);
        std::
        vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
        ::push_back((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                     *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
        std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>::operator[]
                  ((array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL> *)in_stack_fffffffffffffb70,
                   (size_type)in_stack_fffffffffffffb68);
        std::
        vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
        ::push_back((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                     *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
        std::
        vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
        ::push_back((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                     *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
        local_1ec = local_d4;
        local_d4 = local_d4 + 1;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffb70,
                   (value_type_conflict6 *)in_stack_fffffffffffffb68);
        __gnu_cxx::
        __normal_iterator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_*,_std::vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>_>
        ::operator++(&local_1d8);
      }
      std::
      vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
      ::back((vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
              *)in_stack_fffffffffffffb70);
      std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>::operator[]
                ((array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL> *)in_stack_fffffffffffffb70,
                 (size_type)in_stack_fffffffffffffb68);
      in_stack_fffffffffffffc20 = (ValueColorMap *)0x0;
      std::
      vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
      ::back((vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
              *)in_stack_fffffffffffffb70);
      std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>::operator[]
                ((array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL> *)in_stack_fffffffffffffb70,
                 (size_type)in_stack_fffffffffffffb68);
      sVar13 = std::
               vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
               ::size(&local_100);
      std::
      vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
      ::operator[](&local_100,sVar13 - 2);
      std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>::operator[]
                ((array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL> *)in_stack_fffffffffffffb70,
                 (size_type)in_stack_fffffffffffffb68);
      vVar17 = glm::operator-(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
      local_220 = vVar17.field_2;
      in_stack_fffffffffffffc18 = vVar17._0_8_;
      uVar15 = 0;
      auVar3._8_8_ = in_stack_fffffffffffffc20;
      auVar3._0_8_ = in_stack_fffffffffffffc18;
      local_228 = vmovlpd_avx(auVar3);
      local_218 = local_228;
      local_210 = local_220;
      vVar17 = glm::operator*(SUB84(in_stack_fffffffffffffb78,0),in_stack_fffffffffffffb70);
      local_230 = vVar17.field_2;
      in_stack_fffffffffffffbc0 =
           (vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
            *)0x0;
      auVar2._8_8_ = uVar15;
      auVar2._0_8_ = vVar17._0_8_;
      local_238 = vmovlpd_avx(auVar2);
      local_208 = local_238;
      local_200 = local_230;
      vVar17 = glm::operator+(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
      local_240 = vVar17.field_2;
      in_stack_fffffffffffffbb8 = vVar17._0_8_;
      auVar1._8_8_ = in_stack_fffffffffffffbc0;
      auVar1._0_8_ = in_stack_fffffffffffffbb8;
      local_248 = vmovlpd_avx(auVar1);
      local_1f8 = local_248;
      local_1f0 = local_240;
      std::
      vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ::push_back((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
      std::
      vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
      ::back((vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
              *)in_stack_fffffffffffffb70);
      std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>::operator[]
                ((array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL> *)in_stack_fffffffffffffb70,
                 (size_type)in_stack_fffffffffffffb68);
      std::
      vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ::push_back((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
      std::
      vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ::push_back((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
      local_24c = local_d4;
      local_d4 = local_d4 + 1;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffb70,
                 (value_type_conflict6 *)in_stack_fffffffffffffb68);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffb80,
                 (value_type_conflict6 *)in_stack_fffffffffffffb78);
      local_144 = 0;
    }
    std::
    vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
    ::~vector((vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
               *)in_stack_fffffffffffffb80);
  }
  peVar12 = std::
            __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x3d994e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_270,"a_position",&local_271);
  (*peVar12->_vptr_ShaderProgram[0x10])(peVar12,local_270,local_88,0,0,0xffffffff);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  peVar12 = std::
            __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x3d99dd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_298,"a_normal",&local_299);
  (*peVar12->_vptr_ShaderProgram[0x10])(peVar12,local_298,local_a0,0,0,0xffffffff);
  std::__cxx11::string::~string(local_298);
  std::allocator<char>::~allocator((allocator<char> *)&local_299);
  peVar12 = std::
            __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x3d9a6c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c0,"a_color",&local_2c1);
  (*peVar12->_vptr_ShaderProgram[0x10])(peVar12,local_2c0,local_b8,0,0,0xffffffff);
  std::__cxx11::string::~string(local_2c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  peVar14 = std::
            __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x3d9afb);
  (*peVar14->_vptr_ShaderProgram[0x1c])(peVar14,local_d0);
  std::
  __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator*((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             *)in_stack_fffffffffffffb70);
  PersistentValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::get((PersistentValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(in_RDI + 0x98));
  render::Engine::setMaterial
            ((Engine *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
             in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
  geometrycentral::surface::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)peVar12);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::~vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             *)peVar12);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::~vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             *)peVar12);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::~vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             *)peVar12);
  return;
}

Assistant:

void RibbonArtist::createProgram() {

  // Create the program
  program = render::engine->requestShader("RIBBON", {});

  // Set the restart index for the line strip
  unsigned int restartInd = -1;
  program->setPrimitiveRestartIndex(restartInd);

  // Compute length scales and whatnot
  float normalOffset = static_cast<float>(state::lengthScale * normalOffsetFraction);

  // == Fill buffers

  // Trace a whole bunch of lines along the surface
  std::vector<glm::vec3> positions;
  std::vector<glm::vec3> normals;
  std::vector<glm::vec3> colors;
  std::vector<unsigned int> indices;
  unsigned int nPts = 0;
  const render::ValueColorMap& cmapValue = render::engine->getColorMap(cMap);
  for (size_t iLine = 0; iLine < ribbons.size(); iLine++) {

    // Process each point from the list
    std::vector<std::array<glm::vec3, 2>> line = ribbons[iLine];

    // Offset points along normals
    for (std::array<glm::vec3, 2>& x : line) {
      x[0] += x[1] * normalOffset;
    }

    // Fill the render buffer for this line
    if (line.size() <= 1) {
      continue;
    }

    // Sample a color for this line
    glm::vec3 lineColor = cmapValue.getValue(randomUnit());

    // Add a false point at the beginning (so it's not a special case for the geometry shader)
    float EPS = 0.01;
    glm::vec3 fakeFirst = line[0][0] + EPS * (line[0][0] - line[1][0]);
    positions.push_back(fakeFirst);
    normals.push_back(line.front()[1]);
    colors.push_back(lineColor);
    indices.push_back(nPts++);

    // Add all of the real points
    for (auto& pn : line) {
      positions.push_back(pn[0]);
      normals.push_back(pn[1]);
      colors.push_back(lineColor);
      indices.push_back(nPts++);
    }

    // Add a false point at the end too
    glm::vec3 fakeLast = line.back()[0] + EPS * (line.back()[0] - line[line.size() - 2][0]);
    positions.push_back(fakeLast);
    normals.push_back(line.back()[1]);
    colors.push_back(lineColor);
    indices.push_back(nPts++);

    // Restart index allows us to draw multiple lines from a single buffer
    indices.push_back(restartInd);
  }

  // Store the values in GL buffers
  program->setAttribute("a_position", positions);
  program->setAttribute("a_normal", normals);
  program->setAttribute("a_color", colors);
  program->setIndex(indices);

  render::engine->setMaterial(*program, material.get());
}